

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idaFoodWeb_bnd.c
# Opt level: O3

int main(void)

{
  sunrealtype *psVar1;
  sunrealtype *psVar2;
  double dVar3;
  uint uVar4;
  UserData paVar5;
  N_Vector p_Var6;
  sunrealtype **ppsVar7;
  N_Vector cp;
  N_Vector id;
  void *mem;
  long lVar8;
  char *pcVar9;
  uint uVar10;
  sunindextype ml;
  void *mu;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  sunrealtype atol;
  SUNContext ctx;
  sunrealtype tret;
  undefined8 local_70;
  N_Vector local_68;
  UserData local_60;
  long local_58;
  long local_50;
  double local_48;
  sunrealtype local_40;
  void *local_38;
  
  uVar4 = SUNContext_Create(0,&local_70);
  if ((int)uVar4 < 0) {
    pcVar9 = "SUNContext_Create";
  }
  else {
    paVar5 = (UserData)malloc(0x78);
    p_Var6 = (N_Vector)N_VNew_Serial(800,local_70);
    paVar5->rates = p_Var6;
    ppsVar7 = (sunrealtype **)SUNDlsMat_newDenseMat(2,2);
    paVar5->acoef = ppsVar7;
    paVar5->mx = 0x14;
    paVar5->my = 0x14;
    paVar5->ns = 2;
    paVar5->np = 1;
    paVar5->dx = 0.05263157894736842;
    paVar5->dy = 0.05263157894736842;
    paVar5->Neq = 800;
    psVar1 = *ppsVar7;
    psVar2 = ppsVar7[1];
    psVar1[1] = -5e-07;
    *psVar2 = 10000.0;
    *psVar1 = -1.0;
    psVar2[1] = -1.0;
    paVar5->bcoef[0] = 1.0;
    paVar5->bcoef[1] = -1.0;
    *(undefined4 *)paVar5->cox = 1;
    *(undefined4 *)((long)paVar5->cox + 4) = 0x40769000;
    *(undefined4 *)(paVar5->cox + 1) = 0xccccccce;
    *(undefined4 *)((long)paVar5->cox + 0xc) = 0x40320ccc;
    *(undefined4 *)paVar5->coy = 1;
    *(undefined4 *)((long)paVar5->coy + 4) = 0x40769000;
    *(undefined4 *)(paVar5->coy + 1) = 0xccccccce;
    *(undefined4 *)((long)paVar5->coy + 0xc) = 0x40320ccc;
    p_Var6 = (N_Vector)N_VNew_Serial(800,local_70);
    if (p_Var6 == (N_Vector)0x0) {
      main_cold_6();
      return 1;
    }
    cp = (N_Vector)N_VClone(p_Var6);
    if (cp == (N_Vector)0x0) {
      main_cold_5();
      return 1;
    }
    id = (N_Vector)N_VClone(p_Var6);
    if (id == (N_Vector)0x0) {
      main_cold_4();
      return 1;
    }
    SetInitialProfiles(p_Var6,cp,id,paVar5);
    mem = (void *)IDACreate(local_70);
    local_38 = mem;
    if (mem == (void *)0x0) {
      main_cold_3();
      return 1;
    }
    uVar4 = IDASetUserData(mem,paVar5);
    if ((int)uVar4 < 0) {
      pcVar9 = "IDASetUserData";
    }
    else {
      uVar4 = IDASetId(mem,id);
      if ((int)uVar4 < 0) {
        pcVar9 = "IDASetId";
      }
      else {
        uVar4 = IDAInit(0,mem,resweb,p_Var6,cp);
        if ((int)uVar4 < 0) {
          pcVar9 = "IDAInit";
        }
        else {
          atol = 1e-05;
          uVar4 = IDASStolerances(mem);
          if ((int)uVar4 < 0) {
            pcVar9 = "IDASStolerances";
          }
          else {
            lVar8 = SUNBandMatrix(800,0x28,0x28,local_70);
            if (lVar8 == 0) {
              main_cold_2();
              return 1;
            }
            local_50 = SUNLinSol_Band(p_Var6,lVar8,local_70);
            if (local_50 == 0) {
              main_cold_1();
              return 1;
            }
            uVar4 = IDASetLinearSolver(mem,local_50,lVar8);
            if ((int)uVar4 < 0) {
              pcVar9 = "IDASetLinearSolver";
            }
            else {
              uVar10 = 1;
              ml = 1;
              mu = mem;
              local_58 = lVar8;
              uVar4 = IDACalcIC(0xd2f1a9fc);
              if (-1 < (int)uVar4) {
                local_68 = id;
                local_60 = paVar5;
                PrintHeader((sunindextype)mu,ml,
                            (sunrealtype)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da),atol);
                PrintOutput(mem,p_Var6,0.0);
                dVar3 = 0.001;
                do {
                  local_48 = dVar3;
                  uVar4 = IDASolve(mem,&local_40,p_Var6,cp,1);
                  if ((int)uVar4 < 0) {
                    fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with retval = %d\n\n","IDASolve",
                            (ulong)uVar4);
                    return uVar4;
                  }
                  PrintOutput(mem,p_Var6,local_40);
                  dVar3 = local_48 * 10.0;
                  if (2 < uVar10) {
                    dVar3 = local_48 + 0.3;
                  }
                  uVar10 = uVar10 + 1;
                } while (uVar10 != 7);
                PrintFinalStats(mem);
                IDAFree(&local_38);
                SUNLinSolFree(local_50);
                SUNMatDestroy(local_58);
                N_VDestroy(p_Var6);
                N_VDestroy(cp);
                N_VDestroy(local_68);
                paVar5 = local_60;
                SUNDlsMat_destroyMat(local_60->acoef);
                N_VDestroy(paVar5->rates);
                free(paVar5);
                SUNContext_Free(&local_70);
                return 0;
              }
              pcVar9 = "IDACalcIC";
            }
          }
        }
      }
    }
  }
  fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with retval = %d\n\n",pcVar9,(ulong)uVar4);
  return 1;
}

Assistant:

int main(void)
{
  void* mem;
  UserData webdata;
  N_Vector cc, cp, id;
  int iout, retval;
  sunindextype mu, ml;
  sunrealtype rtol, atol, t0, tout, tret;
  SUNMatrix A;
  SUNLinearSolver LS;
  SUNContext ctx;

  mem     = NULL;
  webdata = NULL;
  cc = cp = id = NULL;
  A            = NULL;
  LS           = NULL;

  /* Create the SUNDIALS context object for this simulation */
  retval = SUNContext_Create(SUN_COMM_NULL, &ctx);
  if (check_retval(&retval, "SUNContext_Create", 1)) { return 1; }

  /* Allocate and initialize user data block webdata. */

  webdata        = (UserData)malloc(sizeof *webdata);
  webdata->rates = N_VNew_Serial(NEQ, ctx);
  webdata->acoef = SUNDlsMat_newDenseMat(NUM_SPECIES, NUM_SPECIES);

  InitUserData(webdata);

  /* Allocate N-vectors and initialize cc, cp, and id. */

  cc = N_VNew_Serial(NEQ, ctx);
  if (check_retval((void*)cc, "N_VNew_Serial", 0)) { return (1); }

  cp = N_VClone(cc);
  if (check_retval((void*)cp, "N_VNew_Serial", 0)) { return (1); }

  id = N_VClone(cc);
  if (check_retval((void*)id, "N_VNew_Serial", 0)) { return (1); }

  SetInitialProfiles(cc, cp, id, webdata);

  /* Set remaining inputs to IDAMalloc. */

  t0   = ZERO;
  rtol = RTOL;
  atol = ATOL;

  /* Call IDACreate and IDAMalloc to initialize IDA. */

  mem = IDACreate(ctx);
  if (check_retval((void*)mem, "IDACreate", 0)) { return (1); }

  retval = IDASetUserData(mem, webdata);
  if (check_retval(&retval, "IDASetUserData", 1)) { return (1); }

  retval = IDASetId(mem, id);
  if (check_retval(&retval, "IDASetId", 1)) { return (1); }

  retval = IDAInit(mem, resweb, t0, cc, cp);
  if (check_retval(&retval, "IDAInit", 1)) { return (1); }

  retval = IDASStolerances(mem, rtol, atol);
  if (check_retval(&retval, "IDASStolerances", 1)) { return (1); }

  /* Create banded SUNMatrix for use in linear solves */
  mu = ml = NSMX;
  A       = SUNBandMatrix(NEQ, mu, ml, ctx);
  if (check_retval((void*)A, "SUNBandMatrix", 0)) { return (1); }

  /* Create banded SUNLinearSolver object */
  LS = SUNLinSol_Band(cc, A, ctx);
  if (check_retval((void*)LS, "SUNLinSol_Band", 0)) { return (1); }

  /* Attach the matrix and linear solver */
  retval = IDASetLinearSolver(mem, LS, A);
  if (check_retval(&retval, "IDASetLinearSolver", 1)) { return (1); }

  /* Call IDACalcIC (with default options) to correct the initial values. */

  tout   = SUN_RCONST(0.001);
  retval = IDACalcIC(mem, IDA_YA_YDP_INIT, tout);
  if (check_retval(&retval, "IDACalcIC", 1)) { return (1); }

  /* Print heading, basic parameters, and initial values. */

  PrintHeader(mu, ml, rtol, atol);
  PrintOutput(mem, cc, ZERO);

  /* Loop over iout, call IDASolve (normal mode), print selected output. */

  for (iout = 1; iout <= NOUT; iout++)
  {
    retval = IDASolve(mem, tout, &tret, cc, cp, IDA_NORMAL);
    if (check_retval(&retval, "IDASolve", 1)) { return (retval); }

    PrintOutput(mem, cc, tret);

    if (iout < 3) { tout *= TMULT; }
    else { tout += TADD; }
  }

  /* Print final statistics and free memory. */

  PrintFinalStats(mem);

  /* Free memory */

  IDAFree(&mem);
  SUNLinSolFree(LS);
  SUNMatDestroy(A);

  N_VDestroy(cc);
  N_VDestroy(cp);
  N_VDestroy(id);

  SUNDlsMat_destroyMat(webdata->acoef);
  N_VDestroy(webdata->rates);
  free(webdata);

  SUNContext_Free(&ctx);

  return (0);
}